

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::AnyAverageDownAndSync
          (MLCellLinOp *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *sol)

{
  int ncomp;
  MultiFab *S_fine;
  MultiFab *S_crse;
  long lVar1;
  long lVar2;
  
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  lVar1 = (long)(this->super_MLLinOp).m_num_amr_levels;
  if (1 < lVar1) {
    lVar2 = lVar1 * 8 + -0x10;
    lVar1 = lVar1 + 1;
    do {
      S_fine = Any::get<amrex::MultiFab>
                         ((Any *)((long)&(sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>
                                         ).
                                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1].m_ptr._M_t.
                                         super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                         .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                         _M_head_impl + lVar2));
      S_crse = Any::get<amrex::MultiFab>
                         ((Any *)((long)&(((sol->
                                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                         super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                         .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                         _M_head_impl + lVar2));
      EB_average_down(S_fine,S_crse,0,ncomp,
                      (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar1 + -3]);
      lVar1 = lVar1 + -1;
      lVar2 = lVar2 + -8;
    } while (2 < lVar1);
  }
  return;
}

Assistant:

void
MLCellLinOp::AnyAverageDownAndSync (Vector<Any>& sol) const
{
    AMREX_ASSERT(sol[0].is<MultiFab>());

    int ncomp = getNComp();
    for (int falev = NAMRLevels()-1; falev > 0; --falev)
    {
#ifdef AMREX_USE_EB
        amrex::EB_average_down(sol[falev  ].get<MultiFab>(),
                               sol[falev-1].get<MultiFab>(), 0, ncomp, AMRRefRatio(falev-1));
#else
        amrex::average_down(sol[falev  ].get<MultiFab>(),
                            sol[falev-1].get<MultiFab>(), 0, ncomp, AMRRefRatio(falev-1));
#endif
    }
}